

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_matrix.c
# Opt level: O0

int gdAffineRotate(double *dst,double angle)

{
  double dVar1;
  double dVar2;
  double cos_t;
  double sin_t;
  double angle_local;
  double *dst_local;
  
  dVar1 = sin((angle * 3.141592653589793) / 180.0);
  dVar2 = cos((angle * 3.141592653589793) / 180.0);
  *dst = dVar2;
  dst[1] = dVar1;
  dst[2] = -dVar1;
  dst[3] = dVar2;
  dst[4] = 0.0;
  dst[5] = 0.0;
  return 1;
}

Assistant:

BGD_DECLARE(int) gdAffineRotate (double dst[6], const double angle)
{
	const double sin_t = sin (angle * M_PI / 180.0);
	const double cos_t = cos (angle * M_PI / 180.0);

	dst[0] = cos_t;
	dst[1] = sin_t;
	dst[2] = -sin_t;
	dst[3] = cos_t;
	dst[4] = 0;
	dst[5] = 0;
	return GD_TRUE;
}